

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O0

bool __thiscall
google::protobuf::internal::ExtensionSet::ParseMessageSetItem
          (ExtensionSet *this,CodedInputStream *input,ExtensionFinder *extension_finder,
          MessageSetFieldSkipper *field_skipper)

{
  bool bVar1;
  int size;
  uint uVar2;
  ulong uVar3;
  uint8 *buffer;
  undefined1 local_140 [8];
  CodedOutputStream coded_output;
  StringOutputStream output_stream;
  undefined1 local_108 [4];
  uint32 length;
  string temp;
  CodedInputStream sub_input;
  uint32 type_id;
  undefined1 local_78 [4];
  uint32 tag;
  string message_data;
  uint32 last_type_id;
  MessageSetFieldSkipper *field_skipper_local;
  ExtensionFinder *extension_finder_local;
  CodedInputStream *input_local;
  ExtensionSet *this_local;
  uint32 local_1c;
  uint32 v;
  uint local_c;
  
  message_data.field_2._12_4_ = 0;
  std::__cxx11::string::string((string *)local_78);
  do {
    do {
      while( true ) {
        local_1c = 0;
        if ((input->buffer_ < input->buffer_end_) &&
           (local_1c = (uint32)*input->buffer_, local_1c < 0x80)) {
          io::CodedInputStream::Advance(input,1);
          local_c = local_1c;
        }
        else {
          local_c = io::CodedInputStream::ReadTagFallback(input,local_1c);
        }
        if (local_c == 0) {
          this_local._7_1_ = 0;
          goto LAB_005598c0;
        }
        if (local_c == 0xc) {
          this_local._7_1_ = 1;
          goto LAB_005598c0;
        }
        if (local_c == 0x10) break;
        if (local_c == 0x1a) {
          if (message_data.field_2._12_4_ == 0) {
            std::__cxx11::string::string((string *)local_108);
            bVar1 = io::CodedInputStream::ReadVarint32
                              (input,(uint32 *)((long)&output_stream.target_ + 4));
            if (bVar1) {
              bVar1 = io::CodedInputStream::ReadString
                                (input,(string *)local_108,output_stream.target_._4_4_);
              if (bVar1) {
                io::StringOutputStream::StringOutputStream
                          ((StringOutputStream *)&coded_output.had_error_,(string *)local_78);
                io::CodedOutputStream::CodedOutputStream
                          ((CodedOutputStream *)local_140,
                           (ZeroCopyOutputStream *)&coded_output.had_error_);
                io::CodedOutputStream::WriteVarint32
                          ((CodedOutputStream *)local_140,output_stream.target_._4_4_);
                io::CodedOutputStream::WriteString
                          ((CodedOutputStream *)local_140,(string *)local_108);
                io::CodedOutputStream::~CodedOutputStream((CodedOutputStream *)local_140);
                io::StringOutputStream::~StringOutputStream
                          ((StringOutputStream *)&coded_output.had_error_);
                bVar1 = false;
              }
              else {
                this_local._7_1_ = 0;
                bVar1 = true;
              }
            }
            else {
              this_local._7_1_ = 0;
              bVar1 = true;
            }
            std::__cxx11::string::~string((string *)local_108);
            if (bVar1) goto LAB_005598c0;
          }
          else {
            bVar1 = ParseFieldMaybeLazily
                              (this,2,message_data.field_2._12_4_,input,extension_finder,
                               field_skipper);
            if (!bVar1) {
              this_local._7_1_ = 0;
              goto LAB_005598c0;
            }
          }
        }
        else {
          uVar2 = (*(field_skipper->super_UnknownFieldSetFieldSkipper).super_FieldSkipper.
                    _vptr_FieldSkipper[2])(field_skipper,input,(ulong)local_c);
          if ((uVar2 & 1) == 0) {
            this_local._7_1_ = 0;
            goto LAB_005598c0;
          }
        }
      }
      bVar1 = io::CodedInputStream::ReadVarint32
                        (input,(uint32 *)((long)&sub_input.extension_factory_ + 4));
      if (!bVar1) {
        this_local._7_1_ = 0;
        goto LAB_005598c0;
      }
      message_data.field_2._12_4_ = sub_input.extension_factory_._4_4_;
      uVar3 = std::__cxx11::string::empty();
    } while ((uVar3 & 1) != 0);
    buffer = (uint8 *)std::__cxx11::string::data();
    size = std::__cxx11::string::size();
    io::CodedInputStream::CodedInputStream
              ((CodedInputStream *)((long)&temp.field_2 + 8),buffer,size);
    bVar1 = ParseFieldMaybeLazily
                      (this,2,message_data.field_2._12_4_,
                       (CodedInputStream *)((long)&temp.field_2 + 8),extension_finder,field_skipper)
    ;
    if (bVar1) {
      std::__cxx11::string::clear();
    }
    else {
      this_local._7_1_ = 0;
    }
    io::CodedInputStream::~CodedInputStream((CodedInputStream *)((long)&temp.field_2 + 8));
  } while (bVar1);
LAB_005598c0:
  std::__cxx11::string::~string((string *)local_78);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ExtensionSet::ParseMessageSetItem(io::CodedInputStream* input,
                                       ExtensionFinder* extension_finder,
                                       MessageSetFieldSkipper* field_skipper) {
  // TODO(kenton):  It would be nice to share code between this and
  // WireFormatLite::ParseAndMergeMessageSetItem(), but I think the
  // differences would be hard to factor out.

  // This method parses a group which should contain two fields:
  //   required int32 type_id = 2;
  //   required data message = 3;

  uint32 last_type_id = 0;

  // If we see message data before the type_id, we'll append it to this so
  // we can parse it later.
  string message_data;

  while (true) {
    const uint32 tag = input->ReadTagNoLastTag();
    if (tag == 0) return false;

    switch (tag) {
      case WireFormatLite::kMessageSetTypeIdTag: {
        uint32 type_id;
        if (!input->ReadVarint32(&type_id)) return false;
        last_type_id = type_id;

        if (!message_data.empty()) {
          // We saw some message data before the type_id.  Have to parse it
          // now.
          io::CodedInputStream sub_input(
              reinterpret_cast<const uint8*>(message_data.data()),
              message_data.size());
          if (!ParseFieldMaybeLazily(WireFormatLite::WIRETYPE_LENGTH_DELIMITED,
                                     last_type_id, &sub_input,
                                     extension_finder, field_skipper)) {
            return false;
          }
          message_data.clear();
        }

        break;
      }

      case WireFormatLite::kMessageSetMessageTag: {
        if (last_type_id == 0) {
          // We haven't seen a type_id yet.  Append this data to message_data.
          string temp;
          uint32 length;
          if (!input->ReadVarint32(&length)) return false;
          if (!input->ReadString(&temp, length)) return false;
          io::StringOutputStream output_stream(&message_data);
          io::CodedOutputStream coded_output(&output_stream);
          coded_output.WriteVarint32(length);
          coded_output.WriteString(temp);
        } else {
          // Already saw type_id, so we can parse this directly.
          if (!ParseFieldMaybeLazily(WireFormatLite::WIRETYPE_LENGTH_DELIMITED,
                                     last_type_id, input,
                                     extension_finder, field_skipper)) {
            return false;
          }
        }

        break;
      }

      case WireFormatLite::kMessageSetItemEndTag: {
        return true;
      }

      default: {
        if (!field_skipper->SkipField(input, tag)) return false;
      }
    }
  }
}